

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamTaperedTimoshenko.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementBeamTaperedTimoshenko::GetStateBlock
          (ChElementBeamTaperedTimoshenko *this,ChVectorDynamic<> *mD)

{
  double dVar1;
  double dVar2;
  element_type *peVar3;
  double *pdVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  undefined8 uVar8;
  bool bVar9;
  uint uVar10;
  void *pvVar11;
  undefined8 *puVar12;
  Index index;
  double *pdVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  double dVar23;
  double dVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  double dVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  ChVector<double> delta_rot_dir;
  ChVector<double> displ;
  double local_88 [4];
  double local_68;
  double local_60;
  double local_58;
  double dStack_50;
  double local_48;
  double local_38;
  undefined8 uStack_30;
  
  if ((mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows != 0xc)
  {
    pdVar13 = (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    if (pdVar13 != (double *)0x0) {
      free((void *)pdVar13[-1]);
    }
    pvVar11 = malloc(0xa0);
    if (pvVar11 == (void *)0x0) {
      pdVar13 = (double *)0x0;
    }
    else {
      *(void **)(((ulong)pvVar11 & 0xffffffffffffffc0) + 0x38) = pvVar11;
      pdVar13 = (double *)(((ulong)pvVar11 & 0xffffffffffffffc0) + 0x40);
    }
    if (pdVar13 == (double *)0x0) {
      puVar12 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar12 = std::ostream::_M_insert<bool>;
      __cxa_throw(puVar12,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data = pdVar13;
  }
  (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows = 0xc;
  local_88[0] = 0.0;
  local_88[1] = 0.0;
  local_88[2] = 0.0;
  peVar3 = (((this->nodes).
             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  dVar33 = (this->q_element_abs_rot).m_data[0];
  dVar5 = dVar33 * dVar33;
  dVar23 = (this->q_element_abs_rot).m_data[1];
  dVar24 = (this->q_element_abs_rot).m_data[2];
  dVar1 = (this->q_element_abs_rot).m_data[3];
  dVar33 = -dVar33;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = dVar5 + dVar23 * dVar23;
  auVar17 = vfmadd213sd_avx512f(auVar17,ZEXT816(0x4000000000000000),ZEXT816(0xbff0000000000000));
  dVar7 = dVar23 * dVar24 - dVar1 * dVar33;
  auVar108._8_8_ = 0;
  auVar108._0_8_ = *(ulong *)((long)&peVar3->super_ChNodeFEAbase + 0x20);
  dVar2 = *(double *)&peVar3->field_0x28;
  auVar83._8_8_ = 0;
  auVar83._0_8_ = dVar2 * (dVar7 + dVar7);
  auVar17 = vfmadd231sd_fma(auVar83,auVar108,auVar17);
  dVar7 = dVar24 * dVar33 + dVar23 * dVar1;
  auVar112._8_8_ = 0;
  auVar112._0_8_ = *(ulong *)&peVar3->field_0x30;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar7 + dVar7;
  auVar17 = vfmadd213sd_fma(auVar18,auVar112,auVar17);
  dVar7 = dVar23 * dVar24 + dVar1 * dVar33;
  auVar69._8_8_ = 0;
  auVar69._0_8_ = dVar5 + dVar24 * dVar24;
  auVar18 = vfmadd213sd_avx512f(auVar69,ZEXT816(0x4000000000000000),ZEXT816(0xbff0000000000000));
  auVar34._8_8_ = 0;
  auVar34._0_8_ = dVar7 + dVar7;
  auVar70._8_8_ = 0;
  auVar70._0_8_ = dVar2 * auVar18._0_8_;
  auVar18 = vfmadd231sd_fma(auVar70,auVar108,auVar34);
  dVar7 = dVar24 * dVar1 - dVar23 * dVar33;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar7 + dVar7;
  auVar18 = vfmadd213sd_fma(auVar19,auVar112,auVar18);
  dVar7 = dVar23 * dVar1 - dVar24 * dVar33;
  dVar33 = dVar23 * dVar33 + dVar24 * dVar1;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = dVar7 + dVar7;
  auVar61._8_8_ = 0;
  auVar61._0_8_ = dVar2 * (dVar33 + dVar33);
  auVar34 = vfmadd231sd_fma(auVar61,auVar108,auVar21);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = dVar1 * dVar1 + dVar5;
  auVar61 = ZEXT816(0xbff0000000000000);
  auVar69 = ZEXT816(0x4000000000000000);
  auVar19 = vfmadd213sd_avx512f(auVar20,auVar69,auVar61);
  auVar34 = vfmadd213sd_fma(auVar19,auVar112,auVar34);
  dVar33 = (this->q_element_ref_rot).m_data[0];
  dVar6 = dVar33 * dVar33;
  dVar23 = (this->q_element_ref_rot).m_data[1];
  dVar24 = (this->q_element_ref_rot).m_data[2];
  dVar1 = (this->q_element_ref_rot).m_data[3];
  local_38 = -0.0;
  uStack_30 = 0x8000000000000000;
  dVar33 = -dVar33;
  auVar84._8_8_ = 0;
  auVar84._0_8_ = dVar6 + dVar23 * dVar23;
  auVar19 = vfmadd213sd_avx512f(auVar84,auVar69,auVar61);
  auVar100._8_8_ = 0;
  auVar100._0_8_ = *(ulong *)&((ChCoordsys<double> *)((long)&peVar3->X0 + 8))->pos;
  dVar7 = dVar24 * dVar23 - dVar1 * dVar33;
  dVar2 = *(double *)((long)&peVar3->X0 + 0x10);
  auVar114._8_8_ = 0;
  auVar114._0_8_ = dVar7 + dVar7;
  auVar115._8_8_ = 0;
  auVar115._0_8_ = dVar2;
  auVar20 = vmulsd_avx512f(auVar115,auVar114);
  auVar19 = vfmadd231sd_fma(auVar20,auVar100,auVar19);
  dVar5 = dVar24 * dVar33 + dVar1 * dVar23;
  dVar7 = *(double *)((long)&peVar3->X0 + 0x18);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = dVar5 + dVar5;
  auVar119._8_8_ = 0;
  auVar119._0_8_ = dVar7;
  auVar20 = vfmadd213sd_avx512f(auVar85,auVar119,auVar19);
  dVar5 = dVar24 * dVar23 + dVar1 * dVar33;
  auVar86._8_8_ = 0;
  auVar86._0_8_ = dVar24 * dVar24 + dVar6;
  auVar19 = vfmadd213sd_avx512f(auVar86,auVar69,auVar61);
  auVar19 = vmulsd_avx512f(auVar19,auVar115);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = dVar5 + dVar5;
  auVar19 = vfmadd231sd_fma(auVar19,auVar100,auVar22);
  dVar5 = dVar24 * dVar1 - dVar23 * dVar33;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = dVar5 + dVar5;
  auVar21 = vfmadd213sd_avx512f(auVar47,auVar119,auVar19);
  dVar5 = dVar1 * dVar23 - dVar24 * dVar33;
  dVar33 = dVar23 * dVar33 + dVar24 * dVar1;
  auVar71._8_8_ = 0;
  auVar71._0_8_ = dVar33 + dVar33;
  auVar116._8_8_ = 0;
  auVar116._0_8_ = dVar2;
  auVar19 = vmulsd_avx512f(auVar116,auVar71);
  auVar48._8_8_ = 0;
  auVar48._0_8_ = dVar5 + dVar5;
  auVar19 = vfmadd231sd_fma(auVar19,auVar100,auVar48);
  auVar49._8_8_ = 0;
  auVar49._0_8_ = dVar1 * dVar1 + dVar6;
  auVar22 = vfmadd213sd_avx512f(auVar49,auVar69,auVar61);
  auVar120._8_8_ = 0;
  auVar120._0_8_ = dVar7;
  auVar19 = vfmadd213sd_avx512f(auVar22,auVar120,auVar19);
  local_58 = auVar17._0_8_ - auVar20._0_8_;
  dStack_50 = auVar18._0_8_ - auVar21._0_8_;
  local_48 = auVar34._0_8_ - auVar19._0_8_;
  pdVar13 = (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  uVar16 = 3;
  if ((((ulong)pdVar13 & 7) == 0) &&
     (uVar10 = -((uint)((ulong)pdVar13 >> 3) & 0x1fffffff) & 7, uVar10 < 3)) {
    uVar16 = uVar10;
  }
  if (uVar16 != 0) {
    memcpy(pdVar13,&local_58,(ulong)(uVar16 * 8));
  }
  if (uVar16 < 3) {
    uVar14 = (ulong)(uVar16 << 3);
    memcpy((void *)((long)pdVar13 + uVar14),(void *)((long)&local_58 + uVar14),0x18 - uVar14);
  }
  auVar25._8_8_ = 0;
  auVar25._0_8_ = (this->q_element_abs_rot).m_data[0];
  dVar33 = (this->q_element_abs_rot).m_data[1];
  auVar35._8_8_ = 0;
  auVar35._0_8_ = dVar33;
  dVar23 = (this->q_element_abs_rot).m_data[2];
  auVar72._8_8_ = 0;
  auVar72._0_8_ = dVar23;
  dVar24 = (this->q_element_abs_rot).m_data[3];
  auVar62._8_8_ = 0;
  auVar62._0_8_ = dVar24;
  peVar3 = (((this->nodes).
             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  dVar1 = *(double *)&peVar3->field_0x38;
  auVar87._8_8_ = 0;
  auVar87._0_8_ = dVar1;
  auVar91._8_8_ = 0;
  auVar91._0_8_ = *(double *)&peVar3->field_0x40;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = *(double *)&peVar3->field_0x40 * dVar33;
  auVar17 = vfmadd231sd_fma(auVar40,auVar25,auVar87);
  auVar95._8_8_ = 0;
  auVar95._0_8_ = *(ulong *)&peVar3->field_0x48;
  auVar17 = vfmadd231sd_fma(auVar17,auVar72,auVar95);
  auVar101._8_8_ = 0;
  auVar101._0_8_ = *(ulong *)&peVar3->field_0x50;
  auVar17 = vfmadd231sd_fma(auVar17,auVar62,auVar101);
  auVar50._8_8_ = 0;
  auVar50._0_8_ = dVar1 * dVar33;
  auVar18 = vfmsub231sd_fma(auVar50,auVar25,auVar91);
  auVar18 = vfmadd231sd_fma(auVar18,auVar62,auVar95);
  auVar20 = vfnmadd231sd_fma(auVar18,auVar72,auVar101);
  auVar56._8_8_ = 0;
  auVar56._0_8_ = dVar1 * dVar23;
  auVar18 = vfmsub231sd_fma(auVar56,auVar25,auVar95);
  auVar18 = vfnmadd231sd_fma(auVar18,auVar62,auVar91);
  auVar18 = vfmadd231sd_fma(auVar18,auVar35,auVar101);
  auVar63._8_8_ = 0;
  auVar63._0_8_ = dVar1 * dVar24;
  auVar34 = vfmsub231sd_fma(auVar63,auVar25,auVar101);
  auVar34 = vfmadd231sd_fma(auVar34,auVar72,auVar91);
  auVar21 = vfnmadd231sd_fma(auVar34,auVar35,auVar95);
  dVar33 = (this->q_refrotA).m_data[0];
  auVar73._8_8_ = 0;
  auVar73._0_8_ = dVar33;
  dVar23 = (this->q_refrotA).m_data[1];
  auVar92._8_8_ = 0;
  auVar92._0_8_ = dVar23;
  auVar88._8_8_ = 0;
  auVar88._0_8_ = (this->q_refrotA).m_data[2];
  auVar36._8_8_ = 0;
  auVar36._0_8_ = (this->q_refrotA).m_data[3];
  auVar96._8_8_ = 0;
  auVar96._0_8_ = dVar33 * auVar20._0_8_;
  auVar34 = vfnmadd231sd_fma(auVar96,auVar17,auVar92);
  auVar34 = vfmadd231sd_fma(auVar34,auVar21,auVar88);
  auVar22 = vfnmadd231sd_fma(auVar34,auVar18,auVar36);
  auVar105._8_8_ = 0;
  auVar105._0_8_ = dVar33 * auVar18._0_8_;
  auVar34 = vfnmadd231sd_fma(auVar105,auVar17,auVar88);
  auVar34 = vfnmadd231sd_fma(auVar34,auVar21,auVar92);
  auVar34 = vfmadd231sd_fma(auVar34,auVar20,auVar36);
  auVar109._8_8_ = 0;
  auVar109._0_8_ = dVar33 * auVar21._0_8_;
  auVar19 = vfnmadd231sd_fma(auVar109,auVar17,auVar36);
  auVar19 = vfmadd231sd_fma(auVar19,auVar18,auVar92);
  auVar19 = vfnmadd231sd_fma(auVar19,auVar20,auVar88);
  dVar24 = auVar34._0_8_;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = dVar24 * dVar24;
  auVar34 = vfmadd231sd_fma(auVar26,auVar22,auVar22);
  auVar34 = vfmadd231sd_fma(auVar34,auVar19,auVar19);
  auVar102 = ZEXT816(0);
  dVar33 = auVar34._0_8_;
  if (dVar33 <= 0.0) {
    local_88[0] = 1.0;
    local_88[1] = 0.0;
    local_88[2] = 0.0;
  }
  else {
    local_68 = auVar22._0_8_;
    auVar51._8_8_ = 0;
    auVar51._0_8_ = dVar23 * auVar20._0_8_;
    auVar17 = vfmadd213sd_fma(auVar73,auVar17,auVar51);
    auVar17 = vfmadd213sd_fma(auVar88,auVar18,auVar17);
    auVar17 = vfmadd213sd_fma(auVar36,auVar21,auVar17);
    local_60 = auVar17._0_8_;
    local_88[3] = dVar24;
    if (dVar33 < 0.0) {
      dVar33 = sqrt(dVar33);
    }
    else {
      auVar17 = vsqrtsd_avx(auVar34,auVar34);
      dVar33 = auVar17._0_8_;
    }
    dVar23 = local_60;
    local_60 = dVar33;
    dVar23 = atan2(dVar33,dVar23);
    local_88[2] = 1.0 / local_60;
    local_88[0] = local_88[2] * local_68;
    dVar33 = local_88[2] * local_88[3];
    local_88[2] = local_88[2] * auVar19._0_8_;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = dVar33 * dVar33;
    auVar57._8_8_ = 0;
    auVar57._0_8_ = local_88[0];
    auVar17 = vfmadd231sd_fma(auVar27,auVar57,auVar57);
    auVar74._8_8_ = 0;
    auVar74._0_8_ = local_88[2];
    auVar17 = vfmadd231sd_fma(auVar17,auVar74,auVar74);
    if (auVar17._0_8_ < 0.0) {
      local_88[1] = dVar33;
      local_88[3] = local_88[0];
      local_68 = dVar23;
      local_60 = local_88[2];
      dVar24 = sqrt(auVar17._0_8_);
      local_88[0] = local_88[3];
      local_88[2] = local_60;
      dVar23 = local_68;
    }
    else {
      auVar17 = vsqrtsd_avx(auVar17,auVar17);
      dVar24 = auVar17._0_8_;
    }
    if (dVar24 < 2.2250738585072014e-308) {
      local_88[0] = 1.0;
      local_88[1] = 0.0;
      local_88[2] = 0.0;
    }
    else {
      dVar24 = 1.0 / dVar24;
      local_88[0] = local_88[0] * dVar24;
      local_88[1] = dVar33 * dVar24;
      local_88[2] = local_88[2] * dVar24;
    }
    auVar102._8_8_ = 0;
    auVar102._0_8_ = dVar23 + dVar23;
  }
  dVar33 = auVar102._0_8_;
  if (dVar33 <= 3.141592653589793) {
    if (dVar33 < -3.141592653589793) {
      auVar102._8_8_ = 0;
      auVar102._0_8_ = dVar33 + 6.283185307179586;
    }
  }
  else {
    auVar102._8_8_ = 0;
    auVar102._0_8_ = dVar33 + -6.283185307179586;
  }
  if (5 < (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows) {
    uVar8 = vcmpsd_avx512f(auVar102,ZEXT816(0x400921fb54442d18),0xe);
    bVar9 = (bool)((byte)uVar8 & 1);
    dVar33 = (double)((ulong)bVar9 * (long)(auVar102._0_8_ + -6.283185307179586) +
                     (ulong)!bVar9 * (long)auVar102._0_8_);
    pdVar13 = (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
              + 3;
    uVar14 = 3;
    if ((((ulong)pdVar13 & 7) == 0) &&
       (uVar15 = (ulong)(-((uint)((ulong)pdVar13 >> 3) & 0x1fffffff) & 7), uVar15 < 3)) {
      uVar14 = uVar15;
    }
    if (uVar14 != 0) {
      uVar15 = 0;
      do {
        pdVar13[uVar15] = dVar33 * local_88[uVar15];
        uVar15 = uVar15 + 1;
      } while (uVar14 != uVar15);
    }
    if (uVar14 < 3) {
      do {
        pdVar13[uVar14] = dVar33 * local_88[uVar14];
        uVar14 = uVar14 + 1;
      } while (uVar14 != 3);
    }
    peVar3 = (this->nodes).
             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
             ._M_impl.super__Vector_impl_data._M_start[1].
             super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    dVar33 = (this->q_element_abs_rot).m_data[0];
    dVar5 = dVar33 * dVar33;
    dVar23 = (this->q_element_abs_rot).m_data[1];
    dVar24 = (this->q_element_abs_rot).m_data[2];
    dVar1 = (this->q_element_abs_rot).m_data[3];
    dVar33 = (double)((ulong)local_38 ^ (ulong)dVar33);
    auVar52._8_8_ = 0;
    auVar52._0_8_ = dVar5 + dVar23 * dVar23;
    auVar17 = vfmadd213sd_avx512f(auVar52,ZEXT816(0x4000000000000000),ZEXT816(0xbff0000000000000));
    dVar7 = dVar23 * dVar24 - dVar1 * dVar33;
    auVar106._8_8_ = 0;
    auVar106._0_8_ = *(ulong *)((long)&peVar3->super_ChNodeFEAbase + 0x20);
    dVar2 = *(double *)&peVar3->field_0x28;
    auVar75._8_8_ = 0;
    auVar75._0_8_ = dVar2 * (dVar7 + dVar7);
    auVar17 = vfmadd231sd_fma(auVar75,auVar106,auVar17);
    dVar7 = dVar24 * dVar33 + dVar23 * dVar1;
    auVar111._8_8_ = 0;
    auVar111._0_8_ = *(ulong *)&peVar3->field_0x30;
    auVar53._8_8_ = 0;
    auVar53._0_8_ = dVar7 + dVar7;
    auVar17 = vfmadd213sd_fma(auVar53,auVar111,auVar17);
    dVar7 = dVar23 * dVar24 + dVar1 * dVar33;
    auVar64._8_8_ = 0;
    auVar64._0_8_ = dVar5 + dVar24 * dVar24;
    auVar18 = vfmadd213sd_avx512f(auVar64,ZEXT816(0x4000000000000000),ZEXT816(0xbff0000000000000));
    auVar28._8_8_ = 0;
    auVar28._0_8_ = dVar7 + dVar7;
    auVar65._8_8_ = 0;
    auVar65._0_8_ = dVar2 * auVar18._0_8_;
    auVar18 = vfmadd231sd_fma(auVar65,auVar106,auVar28);
    dVar7 = dVar24 * dVar1 - dVar23 * dVar33;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = dVar7 + dVar7;
    auVar18 = vfmadd213sd_fma(auVar29,auVar111,auVar18);
    dVar7 = dVar23 * dVar1 - dVar24 * dVar33;
    dVar33 = dVar23 * dVar33 + dVar24 * dVar1;
    auVar41._8_8_ = 0;
    auVar41._0_8_ = dVar7 + dVar7;
    auVar58._8_8_ = 0;
    auVar58._0_8_ = dVar2 * (dVar33 + dVar33);
    auVar34 = vfmadd231sd_fma(auVar58,auVar106,auVar41);
    auVar37._8_8_ = 0;
    auVar37._0_8_ = dVar5 + dVar1 * dVar1;
    auVar22 = ZEXT816(0xbff0000000000000);
    auVar47 = ZEXT816(0x4000000000000000);
    auVar19 = vfmadd213sd_avx512f(auVar37,auVar47,auVar22);
    auVar34 = vfmadd213sd_fma(auVar19,auVar111,auVar34);
    dVar33 = (this->q_element_ref_rot).m_data[0];
    dVar6 = dVar33 * dVar33;
    dVar23 = (this->q_element_ref_rot).m_data[1];
    dVar24 = (this->q_element_ref_rot).m_data[2];
    dVar1 = (this->q_element_ref_rot).m_data[3];
    dVar33 = (double)((ulong)local_38 ^ (ulong)dVar33);
    auVar76._8_8_ = 0;
    auVar76._0_8_ = dVar6 + dVar23 * dVar23;
    auVar19 = vfmadd213sd_avx512f(auVar76,auVar47,auVar22);
    auVar97._8_8_ = 0;
    auVar97._0_8_ = *(ulong *)&((ChCoordsys<double> *)((long)&peVar3->X0 + 8))->pos;
    dVar7 = dVar23 * dVar24 - dVar1 * dVar33;
    dVar2 = *(double *)((long)&peVar3->X0 + 0x10);
    auVar113._8_8_ = 0;
    auVar113._0_8_ = dVar2 * (dVar7 + dVar7);
    auVar19 = vfmadd231sd_fma(auVar113,auVar97,auVar19);
    dVar5 = dVar24 * dVar33 + dVar1 * dVar23;
    dVar7 = *(double *)((long)&peVar3->X0 + 0x18);
    auVar77._8_8_ = 0;
    auVar77._0_8_ = dVar5 + dVar5;
    auVar117._8_8_ = 0;
    auVar117._0_8_ = dVar7;
    auVar20 = vfmadd213sd_avx512f(auVar77,auVar117,auVar19);
    dVar5 = dVar23 * dVar24 + dVar1 * dVar33;
    auVar78._8_8_ = 0;
    auVar78._0_8_ = dVar24 * dVar24 + dVar6;
    auVar19 = vfmadd213sd_avx512f(auVar78,auVar47,auVar22);
    auVar42._8_8_ = 0;
    auVar42._0_8_ = dVar5 + dVar5;
    auVar79._8_8_ = 0;
    auVar79._0_8_ = dVar2 * auVar19._0_8_;
    auVar19 = vfmadd231sd_fma(auVar79,auVar97,auVar42);
    dVar5 = dVar1 * dVar24 - dVar23 * dVar33;
    auVar43._8_8_ = 0;
    auVar43._0_8_ = dVar5 + dVar5;
    auVar21 = vfmadd213sd_avx512f(auVar43,auVar117,auVar19);
    dVar5 = dVar1 * dVar23 - dVar24 * dVar33;
    dVar33 = dVar23 * dVar33 + dVar1 * dVar24;
    auVar44._8_8_ = 0;
    auVar44._0_8_ = dVar5 + dVar5;
    auVar66._8_8_ = 0;
    auVar66._0_8_ = dVar2 * (dVar33 + dVar33);
    auVar19 = vfmadd231sd_fma(auVar66,auVar97,auVar44);
    auVar45._8_8_ = 0;
    auVar45._0_8_ = dVar1 * dVar1 + dVar6;
    auVar22 = vfmadd213sd_avx512f(auVar45,auVar47,auVar22);
    auVar118._8_8_ = 0;
    auVar118._0_8_ = dVar7;
    auVar19 = vfmadd213sd_avx512f(auVar22,auVar118,auVar19);
    local_58 = auVar17._0_8_ - auVar20._0_8_;
    dStack_50 = auVar18._0_8_ - auVar21._0_8_;
    local_48 = auVar34._0_8_ - auVar19._0_8_;
    if (8 < (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows) {
      pdVar4 = (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
      ;
      pdVar13 = pdVar4 + 6;
      uVar16 = 3;
      if ((((ulong)pdVar13 & 7) == 0) &&
         (uVar10 = -((uint)((ulong)pdVar13 >> 3) & 0x1fffffff) & 7, uVar10 < 3)) {
        uVar16 = uVar10;
      }
      if (uVar16 != 0) {
        memcpy(pdVar13,&local_58,(ulong)(uVar16 * 8));
      }
      if (uVar16 < 3) {
        uVar14 = (ulong)(uVar16 << 3);
        memcpy((void *)((long)pdVar4 + uVar14 + 0x30),(void *)((long)&local_58 + uVar14),
               0x18 - uVar14);
      }
      auVar30._8_8_ = 0;
      auVar30._0_8_ = (this->q_element_abs_rot).m_data[0];
      dVar33 = (this->q_element_abs_rot).m_data[1];
      auVar38._8_8_ = 0;
      auVar38._0_8_ = dVar33;
      dVar23 = (this->q_element_abs_rot).m_data[2];
      auVar80._8_8_ = 0;
      auVar80._0_8_ = dVar23;
      dVar24 = (this->q_element_abs_rot).m_data[3];
      auVar67._8_8_ = 0;
      auVar67._0_8_ = dVar24;
      peVar3 = (this->nodes).
               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
               ._M_impl.super__Vector_impl_data._M_start[1].
               super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      dVar1 = *(double *)&peVar3->field_0x38;
      auVar89._8_8_ = 0;
      auVar89._0_8_ = dVar1;
      auVar93._8_8_ = 0;
      auVar93._0_8_ = *(double *)&peVar3->field_0x40;
      auVar46._8_8_ = 0;
      auVar46._0_8_ = *(double *)&peVar3->field_0x40 * dVar33;
      auVar17 = vfmadd231sd_fma(auVar46,auVar30,auVar89);
      auVar98._8_8_ = 0;
      auVar98._0_8_ = *(ulong *)&peVar3->field_0x48;
      auVar17 = vfmadd231sd_fma(auVar17,auVar80,auVar98);
      auVar103._8_8_ = 0;
      auVar103._0_8_ = *(ulong *)&peVar3->field_0x50;
      auVar17 = vfmadd231sd_fma(auVar17,auVar67,auVar103);
      auVar54._8_8_ = 0;
      auVar54._0_8_ = dVar1 * dVar33;
      auVar18 = vfmsub231sd_fma(auVar54,auVar30,auVar93);
      auVar18 = vfmadd231sd_fma(auVar18,auVar67,auVar98);
      auVar20 = vfnmadd231sd_fma(auVar18,auVar80,auVar103);
      auVar59._8_8_ = 0;
      auVar59._0_8_ = dVar1 * dVar23;
      auVar18 = vfmsub231sd_fma(auVar59,auVar30,auVar98);
      auVar18 = vfnmadd231sd_fma(auVar18,auVar67,auVar93);
      auVar18 = vfmadd231sd_fma(auVar18,auVar38,auVar103);
      auVar68._8_8_ = 0;
      auVar68._0_8_ = dVar1 * dVar24;
      auVar34 = vfmsub231sd_fma(auVar68,auVar30,auVar103);
      auVar34 = vfmadd231sd_fma(auVar34,auVar80,auVar93);
      auVar21 = vfnmadd231sd_fma(auVar34,auVar38,auVar98);
      dVar33 = (this->q_refrotB).m_data[0];
      auVar81._8_8_ = 0;
      auVar81._0_8_ = dVar33;
      dVar23 = (this->q_refrotB).m_data[1];
      auVar94._8_8_ = 0;
      auVar94._0_8_ = dVar23;
      auVar90._8_8_ = 0;
      auVar90._0_8_ = (this->q_refrotB).m_data[2];
      auVar39._8_8_ = 0;
      auVar39._0_8_ = (this->q_refrotB).m_data[3];
      auVar99._8_8_ = 0;
      auVar99._0_8_ = dVar33 * auVar20._0_8_;
      auVar34 = vfnmadd231sd_fma(auVar99,auVar17,auVar94);
      auVar34 = vfmadd231sd_fma(auVar34,auVar21,auVar90);
      auVar22 = vfnmadd231sd_fma(auVar34,auVar18,auVar39);
      auVar107._8_8_ = 0;
      auVar107._0_8_ = dVar33 * auVar18._0_8_;
      auVar34 = vfnmadd231sd_fma(auVar107,auVar17,auVar90);
      auVar34 = vfnmadd231sd_fma(auVar34,auVar21,auVar94);
      auVar34 = vfmadd231sd_fma(auVar34,auVar20,auVar39);
      auVar110._8_8_ = 0;
      auVar110._0_8_ = dVar33 * auVar21._0_8_;
      auVar19 = vfnmadd231sd_fma(auVar110,auVar17,auVar39);
      auVar19 = vfmadd231sd_fma(auVar19,auVar18,auVar94);
      auVar19 = vfnmadd231sd_fma(auVar19,auVar20,auVar90);
      dVar24 = auVar34._0_8_;
      auVar31._8_8_ = 0;
      auVar31._0_8_ = dVar24 * dVar24;
      auVar34 = vfmadd231sd_fma(auVar31,auVar22,auVar22);
      auVar34 = vfmadd231sd_fma(auVar34,auVar19,auVar19);
      auVar104 = ZEXT816(0);
      dVar33 = auVar34._0_8_;
      if (dVar33 <= 0.0) {
        local_88[0] = 1.0;
        local_88[1] = 0.0;
        local_88[2] = 0.0;
      }
      else {
        local_88[3] = auVar19._0_8_;
        local_38 = auVar22._0_8_;
        auVar55._8_8_ = 0;
        auVar55._0_8_ = dVar23 * auVar20._0_8_;
        auVar17 = vfmadd213sd_fma(auVar81,auVar17,auVar55);
        auVar17 = vfmadd213sd_fma(auVar90,auVar18,auVar17);
        auVar17 = vfmadd213sd_fma(auVar39,auVar21,auVar17);
        local_68 = dVar24;
        if (dVar33 < 0.0) {
          dVar33 = sqrt(dVar33);
        }
        else {
          auVar18 = vsqrtsd_avx(auVar34,auVar34);
          dVar33 = auVar18._0_8_;
        }
        dVar23 = atan2(dVar33,auVar17._0_8_);
        dVar33 = 1.0 / dVar33;
        local_88[0] = dVar33 * local_38;
        local_88[1] = dVar33 * local_68;
        dVar33 = dVar33 * local_88[3];
        auVar32._8_8_ = 0;
        auVar32._0_8_ = local_88[1] * local_88[1];
        auVar60._8_8_ = 0;
        auVar60._0_8_ = local_88[0];
        auVar17 = vfmadd231sd_fma(auVar32,auVar60,auVar60);
        auVar82._8_8_ = 0;
        auVar82._0_8_ = dVar33;
        auVar17 = vfmadd231sd_fma(auVar17,auVar82,auVar82);
        if (auVar17._0_8_ < 0.0) {
          local_88[2] = dVar33;
          local_88[3] = local_88[1];
          local_68 = local_88[0];
          local_38 = dVar23;
          local_88[2] = sqrt(auVar17._0_8_);
          local_88[0] = local_68;
          local_88[1] = local_88[3];
          dVar23 = local_38;
        }
        else {
          auVar17 = vsqrtsd_avx(auVar17,auVar17);
          local_88[2] = auVar17._0_8_;
        }
        if (local_88[2] < 2.2250738585072014e-308) {
          local_88[0] = 1.0;
          local_88[1] = 0.0;
          local_88[2] = 0.0;
        }
        else {
          local_88[2] = 1.0 / local_88[2];
          local_88[0] = local_88[0] * local_88[2];
          local_88[1] = local_88[1] * local_88[2];
          local_88[2] = dVar33 * local_88[2];
        }
        auVar104._8_8_ = 0;
        auVar104._0_8_ = dVar23 + dVar23;
      }
      dVar33 = auVar104._0_8_;
      if (dVar33 <= 3.141592653589793) {
        if (dVar33 < -3.141592653589793) {
          auVar104._8_8_ = 0;
          auVar104._0_8_ = dVar33 + 6.283185307179586;
        }
      }
      else {
        auVar104._8_8_ = 0;
        auVar104._0_8_ = dVar33 + -6.283185307179586;
      }
      if (0xb < (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_rows) {
        uVar8 = vcmpsd_avx512f(auVar104,ZEXT816(0x400921fb54442d18),0xe);
        bVar9 = (bool)((byte)uVar8 & 1);
        dVar33 = (double)((ulong)bVar9 * (long)(auVar104._0_8_ + -6.283185307179586) +
                         (ulong)!bVar9 * (long)auVar104._0_8_);
        pdVar13 = (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                  m_data + 9;
        uVar14 = 3;
        if ((((ulong)pdVar13 & 7) == 0) &&
           (uVar15 = (ulong)(-((uint)((ulong)pdVar13 >> 3) & 0x1fffffff) & 7), uVar15 < 3)) {
          uVar14 = uVar15;
        }
        if (uVar14 != 0) {
          uVar15 = 0;
          do {
            pdVar13[uVar15] = dVar33 * local_88[uVar15];
            uVar15 = uVar15 + 1;
          } while (uVar14 != uVar15);
        }
        if (uVar14 < 3) {
          do {
            pdVar13[uVar14] = dVar33 * local_88[uVar14];
            uVar14 = uVar14 + 1;
          } while (uVar14 != 3);
        }
        return;
      }
    }
  }
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
               );
}

Assistant:

void ChElementBeamTaperedTimoshenko::GetStateBlock(ChVectorDynamic<>& mD) {
    mD.resize(12);

    ChVector<> delta_rot_dir;
    double delta_rot_angle;

    // Node 0, displacement (in local element frame, corotated back)
    //     d = [Atw]' Xt - [A0w]'X0
    ChVector<> displ = this->q_element_abs_rot.RotateBack(nodes[0]->Frame().GetPos()) -
                       this->q_element_ref_rot.RotateBack(nodes[0]->GetX0().GetPos());
    mD.segment(0, 3) = displ.eigen();

    // Node 0, x,y,z small rotations (in local element frame)
    ChQuaternion<> q_delta0 = q_element_abs_rot.GetConjugate() % nodes[0]->Frame().GetRot() % q_refrotA.GetConjugate();
    // note, for small incremental rotations this is opposite of ChNodeFEAxyzrot::VariablesQbIncrementPosition
    q_delta0.Q_to_AngAxis(delta_rot_angle, delta_rot_dir);

    if (delta_rot_angle > CH_C_PI)
        delta_rot_angle -= CH_C_2PI;  // no 0..360 range, use -180..+180

    mD.segment(3, 3) = delta_rot_angle * delta_rot_dir.eigen();

    // Node 1, displacement (in local element frame, corotated back)
    //     d = [Atw]' Xt - [A0w]'X0
    displ = this->q_element_abs_rot.RotateBack(nodes[1]->Frame().GetPos()) -
            this->q_element_ref_rot.RotateBack(nodes[1]->GetX0().GetPos());
    mD.segment(6, 3) = displ.eigen();

    // Node 1, x,y,z small rotations (in local element frame)
    ChQuaternion<> q_delta1 = q_element_abs_rot.GetConjugate() % nodes[1]->Frame().GetRot() % q_refrotB.GetConjugate();
    // note, for small incremental rotations this is opposite of ChNodeFEAxyzrot::VariablesQbIncrementPosition
    q_delta1.Q_to_AngAxis(delta_rot_angle, delta_rot_dir);

    if (delta_rot_angle > CH_C_PI)
        delta_rot_angle -= CH_C_2PI;  // no 0..360 range, use -180..+180

    mD.segment(9, 3) = delta_rot_angle * delta_rot_dir.eigen();
}